

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::FLevel::FindMapBounds(FLevel *this)

{
  fixed_t fVar1;
  double dVar2;
  vertex_t *local_50;
  vertex_t *v;
  int j;
  int i;
  double maxy;
  double miny;
  double maxx;
  double minx;
  FLevel *this_local;
  
  miny = vertex_t::fX(this->Vertices);
  _j = vertex_t::fY(this->Vertices);
  maxy = _j;
  maxx = miny;
  for (v._4_4_ = 1; v._4_4_ < this->NumLines; v._4_4_ = v._4_4_ + 1) {
    for (v._0_4_ = 0; (int)v < 2; v._0_4_ = (int)v + 1) {
      if ((int)v == 0) {
        local_50 = this->Lines[v._4_4_].v1;
      }
      else {
        local_50 = this->Lines[v._4_4_].v2;
      }
      dVar2 = vertex_t::fX(local_50);
      if (maxx <= dVar2) {
        dVar2 = vertex_t::fX(local_50);
        if (miny < dVar2) {
          miny = vertex_t::fX(local_50);
        }
      }
      else {
        maxx = vertex_t::fX(local_50);
      }
      dVar2 = vertex_t::fY(local_50);
      if (maxy <= dVar2) {
        dVar2 = vertex_t::fY(local_50);
        if (_j < dVar2) {
          _j = vertex_t::fY(local_50);
        }
      }
      else {
        maxy = vertex_t::fY(local_50);
      }
    }
  }
  fVar1 = FloatToFixed(maxx);
  this->MinX = fVar1;
  fVar1 = FloatToFixed(maxy);
  this->MinY = fVar1;
  fVar1 = FloatToFixed(miny);
  this->MaxX = fVar1;
  fVar1 = FloatToFixed(_j);
  this->MaxY = fVar1;
  return;
}

Assistant:

void FNodeBuilder::FLevel::FindMapBounds()
{
	double minx, maxx, miny, maxy;

	minx = maxx = Vertices[0].fX();
	miny = maxy = Vertices[0].fY();

	for (int i = 1; i < NumLines; ++i)
	{
		for (int j = 0; j < 2; j++)
		{
			vertex_t *v = (j == 0 ? Lines[i].v1 : Lines[i].v2);
			if (v->fX() < minx) minx = v->fX();
			else if (v->fX() > maxx) maxx = v->fX();
			if (v->fY() < miny) miny = v->fY();
			else if (v->fY() > maxy) maxy = v->fY();
		}
	}

	MinX = FLOAT2FIXED(minx);
	MinY = FLOAT2FIXED(miny);
	MaxX = FLOAT2FIXED(maxx);
	MaxY = FLOAT2FIXED(maxy);
}